

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode cf_hc_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  void *pvVar1;
  CURLcode CVar2;
  ulong local_40;
  size_t i;
  CURLcode result;
  cf_hc_ctx *ctx;
  void *arg2_local;
  int arg1_local;
  int event_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    for (local_40 = 0; local_40 < *(ulong *)((long)pvVar1 + 0x98); local_40 = local_40 + 1) {
      CVar2 = cf_hc_baller_cntrl((cf_hc_baller *)((long)pvVar1 + local_40 * 0x38 + 0x28),data,event,
                                 arg1,arg2);
      if ((CVar2 != CURLE_OK) && (CVar2 != CURLE_AGAIN)) {
        return CVar2;
      }
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cf_hc_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int event, int arg1, void *arg2)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  size_t i;

  if(!cf->connected) {
    for(i = 0; i < ctx->baller_count; i++) {
      result = cf_hc_baller_cntrl(&ctx->ballers[i], data, event, arg1, arg2);
      if(result && (result != CURLE_AGAIN))
        goto out;
    }
    result = CURLE_OK;
  }
out:
  return result;
}